

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_setRange_success_indexAndRangeBeyondSize_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined8 uStack_60;
  char c;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 3;
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  array.capacity = 0x10;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_60 = 0x119a69;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,0x10);
  array.buffer[0] = '0';
  array.buffer[1] = '1';
  array.buffer[2] = '2';
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  c = '3';
  uStack_60 = 0x119aab;
  bVar1 = private_ACUtils_ADynArray_setRange(&array,3,2,&c,1);
  if (bVar1 == true) {
    uStack_60 = 0x119ac5;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x724);
    if (array.size == 5) {
      uStack_60 = 0x119ae5;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x725);
      if (array.capacity == 0x10) {
        uStack_60 = 0x119b05;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x726);
        if (array.buffer == (char *)0x0) {
          ppcVar7 = &local_68;
          pcVar5 = "Assertion \'_ck_x != NULL\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
          pcVar8 = "(void*) array.buffer != NULL";
          pcVar9 = "(void*) array.buffer";
          iVar2 = 0x727;
LAB_0011a054:
          uStack_60 = 0;
          local_68 = (char *)0x0;
          *(code **)((long)ppcVar7 + -8) =
               test_ADynArray_setRange_success_indexAndRangeBeyondSize_bufferExpanded_fn;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
        }
        uStack_60 = 0x119b22;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x727);
        if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
          ppcVar7 = &local_68;
          pcVar5 = "Assertion \'_ck_x != NULL\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
          pcVar8 = "(void*) array.growStrategy != NULL";
          pcVar9 = "(void*) array.growStrategy";
          iVar2 = 0x728;
          goto LAB_0011a054;
        }
        uStack_60 = 0x119b3f;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x728);
        pcVar9 = array.buffer;
        array.buffer[array.size] = '\0';
        if (array.buffer == (char *)0x0) {
          pcVar8 = "";
          pcVar9 = "(null)";
LAB_00119dfe:
          local_70 = "01233";
          pcStack_80 = "array.buffer == \"01233\"";
          pcVar4 = "array.buffer == \"01233\"";
          iVar2 = 0x72a;
        }
        else {
          uStack_60 = 0x119b6a;
          iVar2 = strcmp("01233",array.buffer);
          if (iVar2 != 0) {
            pcVar8 = "\"";
            goto LAB_00119dfe;
          }
          uStack_60 = 0x119b83;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x72a);
          if (private_ACUtilsTest_ADynArray_reallocCount != 0) {
            ppcVar7 = &local_78;
            local_70 = "0";
            local_78 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
            pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
            pcVar9 = "private_ACUtilsTest_ADynArray_reallocCount";
            iVar2 = 0x72b;
            goto LAB_0011a054;
          }
          uStack_60 = 0x119ba4;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x72b);
          c = '6';
          uStack_60 = 0x119bc6;
          bVar1 = private_ACUtils_ADynArray_setRange(&array,0x926,3,&c,1);
          if (bVar1 != true) {
            pcVar4 = 
            "private_ACUtils_ADynArray_setRange(&array, 2342, 3, &(c), sizeof(*(&array)->buffer)) == true"
            ;
            pcVar5 = 
            "private_ACUtils_ADynArray_setRange(&array, 2342, 3, &(c), sizeof(*(&array)->buffer))";
            iVar2 = 0x72d;
            goto LAB_00119ebb;
          }
          uStack_60 = 0x119be0;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x72d);
          if (array.size != 8) {
            local_70 = "8";
            pcVar4 = "array.size == 8";
            pcVar5 = "array.size";
            iVar2 = 0x72e;
            local_68 = (char *)0x8;
            pcVar8 = (char *)array.size;
            goto LAB_00119f2f;
          }
          uStack_60 = 0x119c00;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x72e);
          if (array.capacity != 0x10) {
            iVar2 = 0x72f;
            goto LAB_00119f29;
          }
          uStack_60 = 0x119c20;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x72f);
          if (array.buffer == (char *)0x0) {
            ppcVar7 = &local_68;
            pcVar5 = "Assertion \'_ck_x != NULL\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %#x";
            pcVar8 = "(void*) array.buffer != NULL";
            pcVar9 = "(void*) array.buffer";
            iVar2 = 0x730;
            goto LAB_0011a054;
          }
          uStack_60 = 0x119c3d;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x730);
          if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
            ppcVar7 = &local_68;
            pcVar5 = "Assertion \'_ck_x != NULL\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %#x";
            pcVar8 = "(void*) array.growStrategy != NULL";
            pcVar9 = "(void*) array.growStrategy";
            iVar2 = 0x731;
            goto LAB_0011a054;
          }
          uStack_60 = 0x119c5a;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x731);
          pcVar9 = array.buffer;
          array.buffer[array.size] = '\0';
          if (array.buffer == (char *)0x0) {
            pcVar9 = "(null)";
            pcVar8 = "";
          }
          else {
            uStack_60 = 0x119c85;
            iVar2 = strcmp("01233666",array.buffer);
            if (iVar2 == 0) {
              uStack_60 = 0x119c9e;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x733);
              if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                uStack_60 = 0x119cbf;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x734);
                uStack_60 = 0x119cc8;
                (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
                return;
              }
              ppcVar7 = &local_78;
              local_70 = "0";
              local_78 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
              pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
              pcVar9 = "private_ACUtilsTest_ADynArray_reallocCount";
              iVar2 = 0x734;
              goto LAB_0011a054;
            }
            pcVar8 = "\"";
          }
          local_70 = "01233666";
          pcStack_80 = "array.buffer == \"01233666\"";
          pcVar4 = "array.buffer == \"01233666\"";
          iVar2 = 0x733;
        }
        pcStack_80 = pcStack_80 + 0x10;
        pcVar5 = "array.buffer";
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        local_68 = "\"";
        local_78 = "\"";
        ppcVar6 = &pcStack_90;
        pcStack_90 = pcVar9;
        pcStack_88 = pcVar8;
        goto LAB_0011a009;
      }
      iVar2 = 0x726;
LAB_00119f29:
      local_70 = "16";
      pcVar5 = "array.capacity";
      pcVar4 = "array.capacity == 16";
      local_68 = (char *)0x10;
      pcVar8 = (char *)array.capacity;
    }
    else {
      local_70 = "5";
      pcVar4 = "array.size == 5";
      pcVar5 = "array.size";
      iVar2 = 0x725;
      local_68 = (char *)0x5;
      pcVar8 = (char *)array.size;
    }
  }
  else {
    pcVar4 = 
    "private_ACUtils_ADynArray_setRange(&array, 3, 2, &(c), sizeof(*(&array)->buffer)) == true";
    pcVar5 = "private_ACUtils_ADynArray_setRange(&array, 3, 2, &(c), sizeof(*(&array)->buffer))";
    iVar2 = 0x724;
LAB_00119ebb:
    pcVar8 = (char *)(ulong)bVar1;
    local_70 = "true";
    local_68 = (char *)0x1;
  }
LAB_00119f2f:
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar6 = &local_70;
LAB_0011a009:
  uStack_60 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar8;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x11a010;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar3,pcVar4,pcVar5);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_setRange_success_indexAndRangeBeyondSize)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 3;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 16;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "012", 3);
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '3';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_setRange(&array, 3, 2, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 5);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 16);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.buffer[array.size] = '\0';
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01233");
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    c = '6';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_setRange(&array, 2342, 3, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 16);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.buffer[array.size] = '\0';
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01233666");
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}